

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reflex.h
# Opt level: O3

void __thiscall ClassInfo::ClassInfo(ClassInfo *this,string *className,ObjectConstructorFn ctor)

{
  pointer pcVar1;
  
  this->_vptr_ClassInfo = (_func_int **)&PTR__ClassInfo_00104d58;
  (this->m_className)._M_dataplus._M_p = (pointer)&(this->m_className).field_2;
  pcVar1 = (className->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_className,pcVar1,pcVar1 + className->_M_string_length);
  this->m_objectConstructor = ctor;
  Object::Register(this);
  return;
}

Assistant:

ClassInfo(const std::string className, ObjectConstructorFn ctor)
            :m_className(className), m_objectConstructor(ctor)
    {
        Object::Register(this);       //classInfo的构造函数是传入类名和类对应的new函数然后自动注册进map中。
    }